

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAigerExt.c
# Opt level: O1

int * Gia_AigerReadMapping(uchar **ppPos,int nSize)

{
  byte bVar1;
  uchar *puVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  byte bVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  byte *pbVar12;
  byte *pbVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  byte *pbVar19;
  bool bVar20;
  
  uVar14 = (ulong)(uint)nSize;
  puVar2 = *ppPos;
  lVar8 = 0;
  uVar18 = 0;
  do {
    uVar18 = (long)((int)uVar18 << 8) | (ulong)puVar2[lVar8];
    lVar8 = lVar8 + 1;
  } while ((int)lVar8 != 4);
  pbVar19 = puVar2 + uVar18;
  *ppPos = puVar2 + 4;
  iVar17 = (nSize + (int)pbVar19) - (int)(puVar2 + 4);
  piVar5 = (int *)calloc((long)iVar17,4);
  pbVar13 = *ppPos;
  if (pbVar13 < pbVar19) {
    iVar9 = 0;
    do {
      iVar4 = (int)uVar14;
      pbVar12 = pbVar13 + 1;
      *ppPos = pbVar12;
      uVar10 = (uint)*pbVar13;
      if ((char)*pbVar13 < '\0') {
        bVar6 = 0;
        uVar11 = 0;
        do {
          uVar11 = uVar11 | (uVar10 & 0x7f) << (bVar6 & 0x1f);
          pbVar13 = pbVar12 + 1;
          *ppPos = pbVar13;
          bVar1 = *pbVar12;
          uVar10 = (uint)bVar1;
          bVar6 = bVar6 + 7;
          pbVar12 = pbVar13;
        } while ((char)bVar1 < '\0');
      }
      else {
        bVar6 = 0;
        uVar11 = 0;
        pbVar13 = pbVar12;
      }
      uVar14 = (ulong)(iVar4 + 1U);
      uVar11 = uVar10 << (bVar6 & 0x1f) | uVar11;
      piVar5[iVar4] = uVar11;
      if (-1 < (int)uVar11) {
        uVar14 = (ulong)(int)(iVar4 + 1U);
        pbVar12 = pbVar13;
        uVar10 = 0;
        do {
          pbVar13 = pbVar12 + 1;
          *ppPos = pbVar13;
          uVar15 = (uint)*pbVar12;
          if ((char)*pbVar12 < '\0') {
            bVar6 = 0;
            uVar16 = 0;
            pbVar12 = pbVar13;
            do {
              uVar16 = uVar16 | (uVar15 & 0x7f) << (bVar6 & 0x1f);
              pbVar13 = pbVar12 + 1;
              *ppPos = pbVar13;
              bVar1 = *pbVar12;
              uVar15 = (uint)bVar1;
              bVar6 = bVar6 + 7;
              pbVar12 = pbVar13;
            } while ((char)bVar1 < '\0');
          }
          else {
            bVar6 = 0;
            uVar16 = 0;
          }
          uVar16 = uVar15 << (bVar6 & 0x1f) | uVar16;
          iVar7 = (int)uVar16 >> 1;
          iVar3 = -iVar7;
          if ((uVar16 & 1) != 0) {
            iVar3 = iVar7;
          }
          iVar9 = iVar9 + iVar3;
          piVar5[uVar14] = iVar9;
          uVar14 = uVar14 + 1;
          bVar20 = uVar10 != uVar11;
          pbVar12 = pbVar13;
          uVar10 = uVar10 + 1;
        } while (bVar20);
      }
      piVar5[iVar9] = iVar4;
      nSize = (int)uVar14;
    } while (pbVar13 < pbVar19);
  }
  if (iVar17 < nSize) {
    __assert_fail("iOffset <= nAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaAigerExt.c"
                  ,0xa1,"int *Gia_AigerReadMapping(unsigned char **, int)");
  }
  return piVar5;
}

Assistant:

int * Gia_AigerReadMapping( unsigned char ** ppPos, int nSize )
{
    int * pMapping;
    unsigned char * pStop;
    int k, j, nFanins, nAlloc, iNode = 0, iOffset = nSize;
    pStop = *ppPos;
    pStop += Gia_AigerReadInt( *ppPos ); *ppPos += 4;
    nAlloc = nSize + pStop - *ppPos;
    pMapping = ABC_CALLOC( int, nAlloc );
    while ( *ppPos < pStop )
    {
        k = iOffset;
        pMapping[k++] = nFanins = Gia_AigerReadUnsigned( ppPos );
        for ( j = 0; j <= nFanins; j++ )
            pMapping[k++] = iNode = Gia_AigerReadDiffValue( ppPos, iNode );
        pMapping[iNode] = iOffset;
        iOffset = k;
    }
    assert( iOffset <= nAlloc );
    return pMapping;
}